

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::OnEnd(TypeChecker *this,Label *label,char *sig_desc,char *end_desc)

{
  Result RVar1;
  Result RVar2;
  
  RVar1 = PopAndCheckSignature(this,&label->result_types,sig_desc);
  RVar2 = CheckTypeStackEnd(this,end_desc);
  ResetTypeStackToLabel(this,label);
  PushTypes(this,&label->result_types);
  std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::pop_back
            (&this->label_stack_);
  return (Result)(uint)(RVar2.enum_ == Error || RVar1.enum_ == Error);
}

Assistant:

Result TypeChecker::OnEnd(Label* label,
                          const char* sig_desc,
                          const char* end_desc) {
  Result result = Result::Ok;
  result |= PopAndCheckSignature(label->result_types, sig_desc);
  result |= CheckTypeStackEnd(end_desc);
  ResetTypeStackToLabel(label);
  PushTypes(label->result_types);
  PopLabel();
  return result;
}